

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ActiveTextureTestCase::test(ActiveTextureTestCase *this)

{
  CallLogWrapper *this_00;
  uint in_EAX;
  int iVar1;
  GLint textureUnits;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x84e0,
             0x84c0);
  ApiCase::expectError(&this->super_ApiCase,0);
  uStack_28 = (ulong)(uint)uStack_28;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8b4d,(GLint *)((long)&uStack_28 + 4));
  ApiCase::expectError(&this->super_ApiCase,0);
  for (iVar1 = 0; iVar1 < uStack_28._4_4_; iVar1 = iVar1 + 1) {
    glu::CallLogWrapper::glActiveTexture(this_00,iVar1 + 0x84c0U);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x84e0,
               (ulong)(iVar1 + 0x84c0U));
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, GL_ACTIVE_TEXTURE, GL_TEXTURE0);
		expectError(GL_NO_ERROR);

		GLint textureUnits = 0;
		glGetIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &textureUnits);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < textureUnits; ++ndx)
		{
			glActiveTexture(GL_TEXTURE0 + ndx);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, GL_ACTIVE_TEXTURE, GL_TEXTURE0 + ndx);
			expectError(GL_NO_ERROR);
		}
	}